

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_step_exp(REF_DBL s,REF_DBL *h,REF_DBL h0,REF_DBL h1,REF_DBL h2,REF_DBL s1,REF_DBL s2,
                   REF_DBL width)

{
  double dVar1;
  double dVar2;
  
  dVar1 = tanh((s - s1) / width);
  dVar1 = (dVar1 + 1.0) * 0.5;
  dVar2 = exp((s - s1) / (s2 - s1));
  *h = (1.0 - dVar1) * h0 + (((dVar2 + -1.0) * (h2 - h1)) / 1.718281828459045 + h1) * dVar1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_step_exp(REF_DBL s, REF_DBL *h, REF_DBL h0,
                                       REF_DBL h1, REF_DBL h2, REF_DBL s1,
                                       REF_DBL s2, REF_DBL width) {
  REF_DBL blend, x, e;
  blend = 0.5 * (1.0 + tanh((s - s1) / width));
  x = (s - s1) / (s2 - s1);
  e = h1 + (h2 - h1) * (exp(x) - 1.0) / (exp(1.0) - 1.0);
  *h = (1.0 - blend) * h0 + (blend)*e;
  /* printf("s %f blend %f x %f e %f h %f\n",s,blend,x,e,*h); */
  return REF_SUCCESS;
}